

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_aggregate.cpp
# Opt level: O2

void duckdb::RowOperations::FinalizeStates
               (RowOperationsState *state,TupleDataLayout *layout,Vector *addresses,
               DataChunk *result,idx_t aggr_idx)

{
  optional_ptr<duckdb::FunctionData,_true> __p;
  type target;
  reference pvVar1;
  reference this;
  idx_t i;
  ulong __n;
  AggregateInputData aggr_input_data;
  AggregateInputData local_48;
  
  if ((state->addresses).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t
      .super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&>
              ((duckdb *)&local_48,&LogicalType::POINTER);
    __p.ptr = local_48.bind_data.ptr;
    local_48.bind_data.ptr = (FunctionData *)0x0;
    ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
              ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
               &state->addresses,(pointer)__p.ptr);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_48);
  }
  target = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&state->addresses);
  VectorOperations::Copy(addresses,target,result->count,0,0);
  VectorOperations::AddInPlace(target,layout->data_width + layout->flag_width,result->count);
  for (__n = 0; __n < (ulong)(((long)(layout->aggregates).
                                     super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     .
                                     super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(layout->aggregates).
                                    super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                    .
                                    super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x160);
      __n = __n + 1) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&result->data,aggr_idx + __n);
    this = vector<duckdb::AggregateObject,_true>::get<true>(&layout->aggregates,__n);
    local_48.bind_data.ptr = AggregateObject::GetFunctionData(this);
    local_48.allocator = state->allocator;
    local_48.combine_type = PRESERVE_INPUT;
    (*(this->function).finalize)(target,&local_48,pvVar1,result->count,0);
    VectorOperations::AddInPlace(target,this->payload_size,result->count);
  }
  return;
}

Assistant:

void RowOperations::FinalizeStates(RowOperationsState &state, TupleDataLayout &layout, Vector &addresses,
                                   DataChunk &result, idx_t aggr_idx) {
	// Copy the addresses
	if (!state.addresses) {
		state.addresses = make_uniq<Vector>(LogicalType::POINTER);
	}
	auto &addresses_copy = *state.addresses;
	VectorOperations::Copy(addresses, addresses_copy, result.size(), 0, 0);

	//	Move to the first aggregate state
	VectorOperations::AddInPlace(addresses_copy, UnsafeNumericCast<int64_t>(layout.GetAggrOffset()), result.size());

	auto &aggregates = layout.GetAggregates();
	for (idx_t i = 0; i < aggregates.size(); i++) {
		auto &target = result.data[aggr_idx + i];
		auto &aggr = aggregates[i];
		AggregateInputData aggr_input_data(aggr.GetFunctionData(), state.allocator);
		aggr.function.finalize(addresses_copy, aggr_input_data, target, result.size(), 0);

		// Move to the next aggregate state
		VectorOperations::AddInPlace(addresses_copy, UnsafeNumericCast<int64_t>(aggr.payload_size), result.size());
	}
}